

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O3

bool __thiscall
draco::
DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *this_00;
  pointer *ppIVar1;
  ulong *puVar2;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar3;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *pIVar4;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> IVar5;
  int iVar6;
  iterator iVar7;
  _Bit_type *p_Var8;
  pointer pIVar9;
  CornerTable *pCVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  MeshAttributeIndicesEncodingData *pMVar15;
  ulong uVar16;
  bool bVar17;
  CornerIndex right_corner_id;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_40;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_3c;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_38;
  
  if ((corner_id.value_ != 0xffffffff) &&
     ((*(ulong *)((long)(this->
                        super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                        ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                 (ulong)(corner_id.value_ / 0x18 & 0xfffffff8)) >>
       ((ulong)corner_id.value_ / 3 & 0x3f) & 1) == 0)) {
    pIVar4 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar7._M_current =
         (this->corner_traversal_stack_).
         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar7._M_current != pIVar4) {
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar4;
      iVar7._M_current = pIVar4;
    }
    this_00 = &this->corner_traversal_stack_;
    local_40.value_ = corner_id.value_;
    if (iVar7._M_current ==
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
      ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  *)this_00,iVar7,&local_40);
    }
    else {
      (iVar7._M_current)->value_ = corner_id.value_;
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
    }
    if (local_40.value_ == 0xffffffff) {
      return false;
    }
    pCVar10 = (this->
              super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
              ).corner_table_;
    uVar14 = local_40.value_ - 2;
    if (0x55555555 < (local_40.value_ + 1) * -0x55555555) {
      uVar14 = local_40.value_ + 1;
    }
    if (uVar14 == 0xffffffff) {
      uVar16 = 0xffffffff;
    }
    else {
      uVar16 = (ulong)(pCVar10->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
    }
    if (local_40.value_ * -0x55555555 < 0x55555556) {
      uVar11 = local_40.value_ + 2;
      if (uVar11 == 0xffffffff) {
        return false;
      }
    }
    else {
      uVar11 = local_40.value_ - 1;
    }
    if ((int)uVar16 == -1) {
      return false;
    }
    IVar3.value_ = (pCVar10->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar11].value_;
    if (IVar3.value_ == 0xffffffff) {
      return false;
    }
    p_Var8 = (this->
             super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
             ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_38 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                *)this_00;
    if ((p_Var8[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
      p_Var8[uVar16 >> 6] = p_Var8[uVar16 >> 6] | 1L << ((byte)uVar16 & 0x3f);
      local_3c.value_ = uVar14;
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar14 / 3]._M_elems[uVar14 % 3].
                 value_);
      pMVar15 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_.encoding_data_;
      iVar7._M_current =
           (pMVar15->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (pMVar15->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar15,iVar7,&local_3c);
        pMVar15 = (this->
                  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ).traversal_observer_.encoding_data_;
      }
      else {
        (iVar7._M_current)->value_ = uVar14;
        (pMVar15->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      iVar6 = pMVar15->num_values;
      (pMVar15->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar16]
           = iVar6;
      pMVar15->num_values = iVar6 + 1;
      p_Var8 = (this->
               super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
               ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    }
    if ((p_Var8[IVar3.value_ >> 6] >> ((ulong)IVar3.value_ & 0x3f) & 1) == 0) {
      p_Var8[IVar3.value_ >> 6] = p_Var8[IVar3.value_ >> 6] | 1L << ((byte)IVar3.value_ & 0x3f);
      if (local_40.value_ == 0xffffffff) {
        uVar14 = 0xffffffff;
      }
      else if (local_40.value_ * -0x55555555 < 0x55555556) {
        uVar14 = local_40.value_ + 2;
      }
      else {
        uVar14 = local_40.value_ - 1;
      }
      local_3c.value_ = uVar14;
      PointsSequencer::AddPointId
                ((this->
                 super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                 ).traversal_observer_.sequencer_,
                 (PointIndex)
                 (((this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).traversal_observer_.mesh_)->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar14 / 3]._M_elems[uVar14 % 3].
                 value_);
      pMVar15 = (this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).traversal_observer_.encoding_data_;
      iVar7._M_current =
           (pMVar15->encoded_attribute_value_index_to_corner_map).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (pMVar15->encoded_attribute_value_index_to_corner_map).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
        ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                  ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                    *)pMVar15,iVar7,&local_3c);
        pMVar15 = (this->
                  super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                  ).traversal_observer_.encoding_data_;
      }
      else {
        (iVar7._M_current)->value_ = uVar14;
        (pMVar15->encoded_attribute_value_index_to_corner_map).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
      }
      iVar6 = pMVar15->num_values;
      (pMVar15->vertex_to_encoded_attribute_value_index_map).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [IVar3.value_] = iVar6;
      pMVar15->num_values = iVar6 + 1;
    }
    pIVar9 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pIVar9) {
      do {
        local_40.value_ = pIVar9[-1].value_;
        if (local_40.value_ == 0xffffffff) {
LAB_00134626:
          (this->corner_traversal_stack_).
          super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar9 + -1;
        }
        else {
          uVar12 = (ulong)local_40.value_ / 3;
          p_Var8 = (this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar13 = (ulong)local_40.value_ / 0xc0;
          uVar16 = p_Var8[uVar13];
          if ((uVar16 >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00134626;
          p_Var8[uVar13] = 1L << ((byte)uVar12 & 0x3f) | uVar16;
LAB_0013464d:
          IVar5.value_ = local_40.value_;
          pCVar10 = (this->
                    super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                    ).corner_table_;
          IVar3.value_ = (pCVar10->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_40.value_].value_;
          uVar16 = (ulong)IVar3.value_;
          if (uVar16 == 0xffffffff) {
            return false;
          }
          p_Var8 = (this->
                   super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                   ).is_vertex_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          uVar12 = p_Var8[IVar3.value_ >> 6];
          if ((uVar12 >> (uVar16 & 0x3f) & 1) != 0) {
LAB_0013477b:
            uVar14 = local_40.value_ + 1;
            if (uVar14 * -0x55555555 < 0x55555556) {
              uVar14 = local_40.value_ - 2;
            }
            if (uVar14 == 0xffffffff) {
              local_3c.value_ = 0xffffffff;
            }
            else {
              local_3c.value_ =
                   (pCVar10->opposite_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
            }
            if (local_40.value_ * -0x55555555 < 0x55555556) {
              uVar14 = local_40.value_ + 2;
              if (uVar14 != 0xffffffff) goto LAB_001347cc;
              uVar11 = 0xffffffff;
            }
            else {
              uVar14 = local_40.value_ - 1;
LAB_001347cc:
              uVar11 = (pCVar10->opposite_corners_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
            }
            uVar16 = (ulong)uVar11;
            if (local_3c.value_ != 0xffffffff) {
              p_Var8 = (this->
                       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                       ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
              uVar14 = local_3c.value_ / 3;
              if ((p_Var8[local_3c.value_ / 0xc0] >> ((ulong)local_3c.value_ / 3 & 0x3f) & 1) == 0)
              {
                if ((uVar11 == 0xffffffff) ||
                   (uVar14 = local_3c.value_ / 3,
                   (p_Var8[uVar16 / 0xc0] >> (uVar16 / 3 & 0x3f) & 1) != 0)) goto LAB_0013482a;
                iVar7._M_current =
                     (this->corner_traversal_stack_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                iVar7._M_current[-1].value_ = uVar11;
                if (iVar7._M_current ==
                    (this->corner_traversal_stack_).
                    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                  ::
                  _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                            (local_38,iVar7,&local_3c);
                }
                else {
                  (iVar7._M_current)->value_ = local_3c.value_;
                  (this->corner_traversal_stack_).
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
                }
                goto LAB_00134631;
              }
            }
            if ((uVar11 == 0xffffffff) ||
               (uVar14 = uVar11 / 3, local_3c.value_ = uVar11,
               ((this->
                super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar16 / 0xc0] >>
                (uVar16 / 3 & 0x3f) & 1) != 0)) goto LAB_001348c5;
LAB_0013482a:
            local_40.value_ = local_3c.value_;
            puVar2 = (this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).is_face_visited_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + (uVar14 >> 6)
            ;
            *puVar2 = *puVar2 | 1L << ((byte)uVar14 & 0x3f);
            if (local_40.value_ == 0xffffffff) {
              return false;
            }
            goto LAB_0013464d;
          }
          uVar14 = (pCVar10->vertex_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar16].value_;
          bVar17 = true;
          if (uVar14 != 0xffffffff) {
            uVar11 = uVar14 + 1;
            if (uVar11 * -0x55555555 < 0x55555556) {
              uVar11 = uVar14 - 2;
            }
            if ((uVar11 != 0xffffffff) &&
               (uVar14 = (pCVar10->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar11].value_,
               uVar14 != 0xffffffff)) {
              iVar6 = uVar14 + 1;
              if ((uint)(iVar6 * -0x55555555) < 0x55555556) {
                iVar6 = uVar14 - 2;
              }
              bVar17 = iVar6 == -1;
            }
          }
          p_Var8[IVar3.value_ >> 6] = uVar12 | 1L << ((byte)IVar3.value_ & 0x3f);
          local_3c.value_ = local_40.value_;
          PointsSequencer::AddPointId
                    ((this->
                     super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                     ).traversal_observer_.sequencer_,
                     (PointIndex)
                     (((this->
                       super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                       ).traversal_observer_.mesh_)->faces_).vector_.
                     super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(ulong)local_40.value_ / 3]._M_elems
                     [local_40.value_ % 3].value_);
          pMVar15 = (this->
                    super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                    ).traversal_observer_.encoding_data_;
          iVar7._M_current =
               (pMVar15->encoded_attribute_value_index_to_corner_map).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (pMVar15->encoded_attribute_value_index_to_corner_map).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
            ::_M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                      ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                        *)pMVar15,iVar7,&local_3c);
            pMVar15 = (this->
                      super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                      ).traversal_observer_.encoding_data_;
          }
          else {
            (iVar7._M_current)->value_ = IVar5.value_;
            (pMVar15->encoded_attribute_value_index_to_corner_map).
            super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current + 1;
          }
          iVar6 = pMVar15->num_values;
          (pMVar15->vertex_to_encoded_attribute_value_index_map).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [uVar16] = iVar6;
          pMVar15->num_values = iVar6 + 1;
          pCVar10 = (this->
                    super_TraverserBase<draco::CornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>_>
                    ).corner_table_;
          if (!bVar17) {
            local_3c.value_ = 0xffffffff;
            if (local_40.value_ != 0xffffffff) {
              uVar14 = local_40.value_ + 1;
              if (uVar14 * -0x55555555 < 0x55555556) {
                uVar14 = local_40.value_ - 2;
              }
              if (uVar14 != 0xffffffff) {
                local_3c.value_ =
                     (pCVar10->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].value_;
              }
            }
            uVar14 = local_3c.value_ / 3;
            goto LAB_0013482a;
          }
          if (local_40.value_ != 0xffffffff) goto LAB_0013477b;
LAB_001348c5:
          ppIVar1 = &(this->corner_traversal_stack_).
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + -1;
        }
LAB_00134631:
        pIVar9 = (this->corner_traversal_stack_).
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while ((this->corner_traversal_stack_).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != pIVar9);
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }